

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmnet.h
# Opt level: O0

void TadsHttpRequestHeader::parse_headers
               (TadsHttpRequestHeader **hdr_list,TadsHttpRequestHeader **hdr_tail,int parse_first,
               StringRef *str,long ofs)

{
  uint uVar1;
  char *pcVar2;
  void *pvVar3;
  StringRef *in_RCX;
  long *in_RSI;
  long *in_RDI;
  long in_R8;
  char *p;
  uint in_stack_ffffffffffffffb4;
  char **in_stack_ffffffffffffffb8;
  TadsHttpRequestHeader *in_stack_ffffffffffffffc0;
  
  fix_multiline_headers(in_RCX,(int)((ulong)in_R8 >> 0x20));
  pcVar2 = StringRef::get(in_RCX);
  pcVar2 = pcVar2 + in_R8;
  if (((*pcVar2 != '\0') && (*pcVar2 != '\r')) && (*pcVar2 != '\n')) {
    if (*in_RDI == 0) {
      in_stack_ffffffffffffffb8 = (char **)operator_new(0x18);
      TadsHttpRequestHeader
                (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4);
      *in_RSI = (long)in_stack_ffffffffffffffb8;
      *in_RDI = (long)in_stack_ffffffffffffffb8;
    }
    while( true ) {
      uVar1 = in_stack_ffffffffffffffb4 & 0xffffff;
      if ((*pcVar2 != '\r') && (uVar1 = in_stack_ffffffffffffffb4 & 0xffffff, *pcVar2 != '\n')) {
        uVar1 = CONCAT13(*pcVar2 != '\0',(int3)in_stack_ffffffffffffffb4);
      }
      in_stack_ffffffffffffffb4 = uVar1;
      if ((char)(in_stack_ffffffffffffffb4 >> 0x18) == '\0') break;
      pvVar3 = operator_new(0x18);
      TadsHttpRequestHeader
                (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4);
      *(void **)(*in_RSI + 0x10) = pvVar3;
      *in_RSI = (long)pvVar3;
    }
  }
  return;
}

Assistant:

static void parse_headers(TadsHttpRequestHeader *&hdr_list,
                              TadsHttpRequestHeader *&hdr_tail,
                              int parse_first,
                              StringRef *str, long ofs)
    {
        /* fix multiline headers */
        fix_multiline_headers(str, ofs);

        /* set up at the starting offset */
        char *p = str->get() + ofs;
        
        /* if we're already at a blank line, there are no headers */
        if (*p == '\0' || *p == '\r' || *p == '\n')
            return;
        
        /* 
         *   if there aren't any headers yet, parse the first one; otherwise
         *   we'll just add to the existing list 
         */
        if (hdr_list == 0)
            hdr_list = hdr_tail = new TadsHttpRequestHeader(p, parse_first);
        
        /* now parse until we find a blank line */
        while (*p != '\r' && *p != '\n' && *p != '\0')
            hdr_tail = hdr_tail->nxt = new TadsHttpRequestHeader(p, TRUE);
    }